

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::
HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::MessageReader>,_bool,_kj::CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-async.c++:154:45),_kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader>_>,_kj::_::PropagateException>_>
::disposeImpl(HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::MessageReader>,_bool,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_serialize_async_c__:154:45),_kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader>_>,_kj::_::PropagateException>_>
              *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::MessageReader>,_bool,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_serialize_async_c__:154:45),_kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader>_>,_kj::_::PropagateException>_>
  *this_local;
  
  if (pointer != (void *)0x0) {
    TransformPromiseNode<kj::Own<capnp::MessageReader>,_bool,_kj::CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-async.c++:154:45),_kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader>_>,_kj::_::PropagateException>
    ::~TransformPromiseNode
              ((TransformPromiseNode<kj::Own<capnp::MessageReader>,_bool,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_serialize_async_c__:154:45),_kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader>_>,_kj::_::PropagateException>
                *)pointer);
    operator_delete(pointer,0x40);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }